

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::json_abi_v3_11_3::detail::
serializer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
::dump(serializer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
       *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *val,bool pretty_print,bool ensure_ascii,uint indent_step,uint current_indent)

{
  value_t vVar1;
  _func_int **pp_Var2;
  array_t *paVar3;
  binary_t *pbVar4;
  _Rb_tree_node_base *p_Var5;
  pointer pbVar6;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  undefined8 uVar7;
  char *pcVar8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *val_00;
  pointer pcVar9;
  element_type *peVar10;
  uint uVar11;
  const_iterator i_1;
  pointer pbVar13;
  const_iterator i;
  ulong uVar14;
  ulong uVar12;
  
  vVar1 = (val->m_data).m_type;
  if (discarded < vVar1) {
    return;
  }
  switch(vVar1) {
  case null:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar10->_vptr_output_adapter_protocol[1];
    pcVar8 = "null";
    break;
  case object:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    pp_Var2 = peVar10->_vptr_output_adapter_protocol;
    if ((((val->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
      UNRECOVERED_JUMPTABLE_00 = pp_Var2[1];
      pcVar8 = "{}";
      goto LAB_001d357f;
    }
    if (pretty_print) {
      (*pp_Var2[1])(peVar10,"{\n",2);
      uVar11 = current_indent + indent_step;
      uVar12 = (ulong)uVar11;
      uVar14 = (this->indent_string)._M_string_length;
      if (uVar14 < uVar12) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                  (&this->indent_string,uVar14 * 2,' ');
      }
      pbVar4 = (val->m_data).m_value.binary;
      p_Var5 = (_Rb_tree_node_base *)pbVar4->m_subtype;
      if (pbVar4[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x1) {
        uVar14 = 0;
        do {
          peVar10 = (this->o).
                    super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (*peVar10->_vptr_output_adapter_protocol[1])
                    (peVar10,(this->indent_string)._M_dataplus._M_p,uVar12);
          peVar10 = (this->o).
                    super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x22);
          dump_escaped(this,(string_t *)(p_Var5 + 1),ensure_ascii);
          peVar10 = (this->o).
                    super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"\": ",3);
          dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)(p_Var5 + 2),true,ensure_ascii,indent_step,uVar11);
          peVar10 = (this->o).
                    super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,",\n",2);
          uVar14 = uVar14 + 1;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        } while (uVar14 < (((val->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header.
                          _M_node_count - 1);
      }
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar10->_vptr_output_adapter_protocol[1])
                (peVar10,(this->indent_string)._M_dataplus._M_p,uVar12);
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x22);
      dump_escaped(this,(string_t *)(p_Var5 + 1),ensure_ascii);
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"\": ",3);
      dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)(p_Var5 + 2),true,ensure_ascii,indent_step,uVar11);
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (**peVar10->_vptr_output_adapter_protocol)(peVar10,10);
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      pcVar9 = (this->indent_string)._M_dataplus._M_p;
      goto LAB_001d365a;
    }
    (**pp_Var2)(peVar10,0x7b);
    pbVar4 = (val->m_data).m_value.binary;
    p_Var5 = (_Rb_tree_node_base *)pbVar4->m_subtype;
    if (pbVar4[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x1) {
      uVar14 = 0;
      do {
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x22);
        dump_escaped(this,(string_t *)(p_Var5 + 1),ensure_ascii);
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"\":",2);
        dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)(p_Var5 + 2),false,ensure_ascii,indent_step,current_indent);
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x2c);
        uVar14 = uVar14 + 1;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while (uVar14 < (((val->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header.
                        _M_node_count - 1);
    }
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x22);
    dump_escaped(this,(string_t *)(p_Var5 + 1),ensure_ascii);
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"\":",2);
    dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)(p_Var5 + 2),false,ensure_ascii,indent_step,current_indent);
    goto LAB_001d375b;
  case array:
    paVar3 = (val->m_data).m_value.array;
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    pp_Var2 = peVar10->_vptr_output_adapter_protocol;
    if ((paVar3->
        super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (paVar3->
        super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      if (pretty_print) {
        (*pp_Var2[1])(peVar10,"[\n",2);
        uVar11 = current_indent + indent_step;
        uVar12 = (ulong)uVar11;
        uVar14 = (this->indent_string)._M_string_length;
        if (uVar14 < uVar12) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                    (&this->indent_string,uVar14 * 2,' ');
        }
        paVar3 = (val->m_data).m_value.array;
        pbVar13 = (paVar3->
                  super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (pbVar13 !=
            (paVar3->
            super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
            )._M_impl.super__Vector_impl_data._M_finish + -1) {
          do {
            peVar10 = (this->o).
                      super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            (*peVar10->_vptr_output_adapter_protocol[1])
                      (peVar10,(this->indent_string)._M_dataplus._M_p,uVar12);
            dump(this,pbVar13,true,ensure_ascii,indent_step,uVar11);
            peVar10 = (this->o).
                      super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,",\n",2);
            pbVar13 = pbVar13 + 1;
          } while (pbVar13 !=
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)(((val->m_data).m_value.string)->_M_string_length - 0x10));
        }
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar10->_vptr_output_adapter_protocol[1])
                  (peVar10,(this->indent_string)._M_dataplus._M_p,uVar12);
        dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)(((val->m_data).m_value.string)->_M_string_length - 0x10),true,ensure_ascii,
             indent_step,uVar11);
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (**peVar10->_vptr_output_adapter_protocol)(peVar10,10);
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar10->_vptr_output_adapter_protocol[1])
                  (peVar10,(this->indent_string)._M_dataplus._M_p,(ulong)current_indent);
      }
      else {
        (**pp_Var2)(peVar10,0x5b);
        paVar3 = (val->m_data).m_value.array;
        pbVar13 = (paVar3->
                  super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        val_00 = (paVar3->
                 super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + -1;
        if (pbVar13 != val_00) {
          do {
            dump(this,pbVar13,false,ensure_ascii,indent_step,current_indent);
            peVar10 = (this->o).
                      super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x2c);
            pbVar13 = pbVar13 + 1;
            val_00 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)(((val->m_data).m_value.string)->_M_string_length - 0x10);
          } while (pbVar13 != val_00);
        }
        dump(this,val_00,false,ensure_ascii,indent_step,current_indent);
      }
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      UNRECOVERED_JUMPTABLE_00 = *peVar10->_vptr_output_adapter_protocol;
      uVar7 = 0x5d;
      goto LAB_001d3769;
    }
    UNRECOVERED_JUMPTABLE_00 = pp_Var2[1];
    pcVar8 = "[]";
LAB_001d357f:
    uVar7 = 2;
    goto LAB_001d367b;
  case string:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x22);
    dump_escaped(this,(string_t *)(val->m_data).m_value.object,ensure_ascii);
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = *peVar10->_vptr_output_adapter_protocol;
    uVar7 = 0x22;
    goto LAB_001d3769;
  case boolean:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar10->_vptr_output_adapter_protocol[1];
    if ((val->m_data).m_value.boolean != true) {
      pcVar8 = "false";
LAB_001d3676:
      uVar7 = 5;
      goto LAB_001d367b;
    }
    pcVar8 = "true";
    break;
  case number_integer:
    dump_integer<long,_0>(this,(val->m_data).m_value.number_integer);
    return;
  case number_unsigned:
    dump_integer<unsigned_long,_0>(this,(val->m_data).m_value.number_unsigned);
    return;
  case number_float:
    dump_float(this,(val->m_data).m_value.number_float);
    return;
  case binary:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    if (!pretty_print) {
      (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"{\"bytes\":[",10);
      paVar3 = (val->m_data).m_value.array;
      pbVar13 = (paVar3->
                super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar6 = (paVar3->
               super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar13 != pbVar6) {
        for (; pbVar6 = (pointer)((long)&pbVar6[-1].m_data.m_value + 7), pbVar13 != pbVar6;
            pbVar13 = (pointer)&(pbVar13->m_data).field_0x1) {
          dump_integer<unsigned_char,_0>(this,(pbVar13->m_data).m_type);
          peVar10 = (this->o).
                    super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x2c);
          pbVar6 = (pointer)((val->m_data).m_value.string)->_M_string_length;
        }
        dump_integer<unsigned_char,_0>(this,(pbVar6->m_data).m_type);
      }
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"],\"subtype\":",0xc);
      pbVar4 = (val->m_data).m_value.binary;
      if (pbVar4->m_has_subtype == true) {
        dump_integer<unsigned_long,_0>(this,pbVar4->m_subtype);
        goto LAB_001d375b;
      }
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      UNRECOVERED_JUMPTABLE_00 = peVar10->_vptr_output_adapter_protocol[1];
      pcVar8 = "null}";
      goto LAB_001d3676;
    }
    (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"{\n",2);
    uVar12 = (ulong)(indent_step + current_indent);
    uVar14 = (this->indent_string)._M_string_length;
    if (uVar14 < uVar12) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                (&this->indent_string,uVar14 * 2,' ');
    }
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (*peVar10->_vptr_output_adapter_protocol[1])
              (peVar10,(this->indent_string)._M_dataplus._M_p,uVar12);
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"\"bytes\": [",10);
    paVar3 = (val->m_data).m_value.array;
    pbVar13 = (paVar3->
              super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar6 = (paVar3->
             super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar13 != pbVar6) {
      pbVar6 = (pointer)((long)&pbVar6[-1].m_data.m_value + 7);
      if (pbVar13 != pbVar6) {
        do {
          dump_integer<unsigned_char,_0>(this,(pbVar13->m_data).m_type);
          peVar10 = (this->o).
                    super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,", ",2);
          pbVar13 = (pointer)&(pbVar13->m_data).field_0x1;
          pbVar6 = (pointer)(((val->m_data).m_value.string)->_M_string_length - 1);
        } while (pbVar13 != pbVar6);
      }
      dump_integer<unsigned_char,_0>(this,(pbVar6->m_data).m_type);
    }
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"],\n",3);
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (*peVar10->_vptr_output_adapter_protocol[1])
              (peVar10,(this->indent_string)._M_dataplus._M_p,uVar12);
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"\"subtype\": ",0xb);
    pbVar4 = (val->m_data).m_value.binary;
    if (pbVar4->m_has_subtype == true) {
      dump_integer<unsigned_long,_0>(this,pbVar4->m_subtype);
    }
    else {
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"null",4);
    }
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (**peVar10->_vptr_output_adapter_protocol)(peVar10,10);
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    pcVar9 = (this->indent_string)._M_dataplus._M_p;
LAB_001d365a:
    (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,pcVar9,(ulong)current_indent);
LAB_001d375b:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = *peVar10->_vptr_output_adapter_protocol;
    uVar7 = 0x7d;
LAB_001d3769:
    (*UNRECOVERED_JUMPTABLE_00)(peVar10,uVar7);
    return;
  case discarded:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_11_3::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar10->_vptr_output_adapter_protocol[1];
    pcVar8 = "<discarded>";
    uVar7 = 0xb;
    goto LAB_001d367b;
  }
  uVar7 = 4;
LAB_001d367b:
  (*UNRECOVERED_JUMPTABLE_00)(peVar10,pcVar8,uVar7);
  return;
}

Assistant:

void dump(const BasicJsonType& val,
              const bool pretty_print,
              const bool ensure_ascii,
              const unsigned int indent_step,
              const unsigned int current_indent = 0)
    {
        switch (val.m_data.m_type)
        {
            case value_t::object:
            {
                if (val.m_data.m_value.object->empty())
                {
                    o->write_characters("{}", 2);
                    return;
                }

                if (pretty_print)
                {
                    o->write_characters("{\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    // first n-1 elements
                    auto i = val.m_data.m_value.object->cbegin();
                    for (std::size_t cnt = 0; cnt < val.m_data.m_value.object->size() - 1; ++cnt, ++i)
                    {
                        o->write_characters(indent_string.c_str(), new_indent);
                        o->write_character('\"');
                        dump_escaped(i->first, ensure_ascii);
                        o->write_characters("\": ", 3);
                        dump(i->second, true, ensure_ascii, indent_step, new_indent);
                        o->write_characters(",\n", 2);
                    }

                    // last element
                    JSON_ASSERT(i != val.m_data.m_value.object->cend());
                    JSON_ASSERT(std::next(i) == val.m_data.m_value.object->cend());
                    o->write_characters(indent_string.c_str(), new_indent);
                    o->write_character('\"');
                    dump_escaped(i->first, ensure_ascii);
                    o->write_characters("\": ", 3);
                    dump(i->second, true, ensure_ascii, indent_step, new_indent);

                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character('}');
                }
                else
                {
                    o->write_character('{');

                    // first n-1 elements
                    auto i = val.m_data.m_value.object->cbegin();
                    for (std::size_t cnt = 0; cnt < val.m_data.m_value.object->size() - 1; ++cnt, ++i)
                    {
                        o->write_character('\"');
                        dump_escaped(i->first, ensure_ascii);
                        o->write_characters("\":", 2);
                        dump(i->second, false, ensure_ascii, indent_step, current_indent);
                        o->write_character(',');
                    }

                    // last element
                    JSON_ASSERT(i != val.m_data.m_value.object->cend());
                    JSON_ASSERT(std::next(i) == val.m_data.m_value.object->cend());
                    o->write_character('\"');
                    dump_escaped(i->first, ensure_ascii);
                    o->write_characters("\":", 2);
                    dump(i->second, false, ensure_ascii, indent_step, current_indent);

                    o->write_character('}');
                }

                return;
            }

            case value_t::array:
            {
                if (val.m_data.m_value.array->empty())
                {
                    o->write_characters("[]", 2);
                    return;
                }

                if (pretty_print)
                {
                    o->write_characters("[\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    // first n-1 elements
                    for (auto i = val.m_data.m_value.array->cbegin();
                            i != val.m_data.m_value.array->cend() - 1; ++i)
                    {
                        o->write_characters(indent_string.c_str(), new_indent);
                        dump(*i, true, ensure_ascii, indent_step, new_indent);
                        o->write_characters(",\n", 2);
                    }

                    // last element
                    JSON_ASSERT(!val.m_data.m_value.array->empty());
                    o->write_characters(indent_string.c_str(), new_indent);
                    dump(val.m_data.m_value.array->back(), true, ensure_ascii, indent_step, new_indent);

                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character(']');
                }
                else
                {
                    o->write_character('[');

                    // first n-1 elements
                    for (auto i = val.m_data.m_value.array->cbegin();
                            i != val.m_data.m_value.array->cend() - 1; ++i)
                    {
                        dump(*i, false, ensure_ascii, indent_step, current_indent);
                        o->write_character(',');
                    }

                    // last element
                    JSON_ASSERT(!val.m_data.m_value.array->empty());
                    dump(val.m_data.m_value.array->back(), false, ensure_ascii, indent_step, current_indent);

                    o->write_character(']');
                }

                return;
            }

            case value_t::string:
            {
                o->write_character('\"');
                dump_escaped(*val.m_data.m_value.string, ensure_ascii);
                o->write_character('\"');
                return;
            }

            case value_t::binary:
            {
                if (pretty_print)
                {
                    o->write_characters("{\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    o->write_characters(indent_string.c_str(), new_indent);

                    o->write_characters("\"bytes\": [", 10);

                    if (!val.m_data.m_value.binary->empty())
                    {
                        for (auto i = val.m_data.m_value.binary->cbegin();
                                i != val.m_data.m_value.binary->cend() - 1; ++i)
                        {
                            dump_integer(*i);
                            o->write_characters(", ", 2);
                        }
                        dump_integer(val.m_data.m_value.binary->back());
                    }

                    o->write_characters("],\n", 3);
                    o->write_characters(indent_string.c_str(), new_indent);

                    o->write_characters("\"subtype\": ", 11);
                    if (val.m_data.m_value.binary->has_subtype())
                    {
                        dump_integer(val.m_data.m_value.binary->subtype());
                    }
                    else
                    {
                        o->write_characters("null", 4);
                    }
                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character('}');
                }
                else
                {
                    o->write_characters("{\"bytes\":[", 10);

                    if (!val.m_data.m_value.binary->empty())
                    {
                        for (auto i = val.m_data.m_value.binary->cbegin();
                                i != val.m_data.m_value.binary->cend() - 1; ++i)
                        {
                            dump_integer(*i);
                            o->write_character(',');
                        }
                        dump_integer(val.m_data.m_value.binary->back());
                    }

                    o->write_characters("],\"subtype\":", 12);
                    if (val.m_data.m_value.binary->has_subtype())
                    {
                        dump_integer(val.m_data.m_value.binary->subtype());
                        o->write_character('}');
                    }
                    else
                    {
                        o->write_characters("null}", 5);
                    }
                }
                return;
            }

            case value_t::boolean:
            {
                if (val.m_data.m_value.boolean)
                {
                    o->write_characters("true", 4);
                }
                else
                {
                    o->write_characters("false", 5);
                }
                return;
            }

            case value_t::number_integer:
            {
                dump_integer(val.m_data.m_value.number_integer);
                return;
            }

            case value_t::number_unsigned:
            {
                dump_integer(val.m_data.m_value.number_unsigned);
                return;
            }

            case value_t::number_float:
            {
                dump_float(val.m_data.m_value.number_float);
                return;
            }

            case value_t::discarded:
            {
                o->write_characters("<discarded>", 11);
                return;
            }

            case value_t::null:
            {
                o->write_characters("null", 4);
                return;
            }

            default:            // LCOV_EXCL_LINE
                JSON_ASSERT(false); // NOLINT(cert-dcl03-c,hicpp-static-assert,misc-static-assert) LCOV_EXCL_LINE
        }
    }